

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigen_Colamd.h
# Opt level: O0

void Eigen::internal::detect_super_cols<int>
               (colamd_col<int> *Col,int *A,int *head,int row_start,int row_length)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int local_74;
  int first_col;
  int head_column;
  int col;
  int *rp_end;
  int local_58;
  int i;
  int prev_c;
  int length;
  int *cp2;
  int *cp1;
  int super_c;
  int c;
  int *rp;
  int hash;
  int row_length_local;
  int row_start_local;
  int *head_local;
  int *A_local;
  colamd_col<int> *Col_local;
  
  _super_c = A + row_start;
  do {
    do {
      if (A + row_start + row_length <= _super_c) {
        return;
      }
      piVar4 = _super_c + 1;
      iVar1 = *_super_c;
      _super_c = piVar4;
    } while (Col[iVar1].start < 0);
    iVar1 = Col[iVar1].shared3.headhash;
    iVar2 = head[iVar1];
    if (iVar2 < 0) {
      local_74 = -(iVar2 + 2);
    }
    else {
      local_74 = Col[iVar2].shared3.headhash;
    }
    for (cp1._0_4_ = local_74; (int)cp1 != -1; cp1._0_4_ = Col[(int)cp1].shared4.degree_next) {
      iVar3 = Col[(int)cp1].length;
      local_58 = (int)cp1;
      for (cp1._4_4_ = Col[(int)cp1].shared4.degree_next; cp1._4_4_ != -1;
          cp1._4_4_ = Col[cp1._4_4_].shared4.degree_next) {
        if ((Col[cp1._4_4_].length == iVar3) &&
           (Col[cp1._4_4_].shared2.score == Col[(int)cp1].shared2.score)) {
          _prev_c = A + Col[cp1._4_4_].start;
          cp2 = A + Col[(int)cp1].start;
          for (rp_end._4_4_ = 0; rp_end._4_4_ < iVar3; rp_end._4_4_ = rp_end._4_4_ + 1) {
            if (*cp2 != *_prev_c) break;
            _prev_c = _prev_c + 1;
            cp2 = cp2 + 1;
          }
          if (rp_end._4_4_ == iVar3) {
            Col[(int)cp1].shared1.thickness =
                 Col[cp1._4_4_].shared1.thickness + Col[(int)cp1].shared1.thickness;
            Col[cp1._4_4_].shared1.thickness = (int)cp1;
            Col[cp1._4_4_].start = -2;
            Col[cp1._4_4_].shared2.score = -1;
            Col[local_58].shared4 = Col[cp1._4_4_].shared4;
          }
          else {
            local_58 = cp1._4_4_;
          }
        }
        else {
          local_58 = cp1._4_4_;
        }
      }
    }
    if (iVar2 < 0) {
      head[iVar1] = -1;
    }
    else {
      Col[iVar2].shared3.headhash = -1;
    }
  } while( true );
}

Assistant:

static void detect_super_cols
(
  /* === Parameters ======================================================= */
  
  colamd_col<Index> Col [],    /* of size n_col+1 */
  Index A [],     /* row indices of A */
  Index head [],    /* head of degree lists and hash buckets */
  Index row_start,    /* pointer to set of columns to check */
  Index row_length    /* number of columns to check */
)
{
  /* === Local variables ================================================== */

  Index hash ;      /* hash value for a column */
  Index *rp ;     /* pointer to a row */
  Index c ;     /* a column index */
  Index super_c ;   /* column index of the column to absorb into */
  Index *cp1 ;      /* column pointer for column super_c */
  Index *cp2 ;      /* column pointer for column c */
  Index length ;    /* length of column super_c */
  Index prev_c ;    /* column preceding c in hash bucket */
  Index i ;     /* loop counter */
  Index *rp_end ;   /* pointer to the end of the row */
  Index col ;     /* a column index in the row to check */
  Index head_column ;   /* first column in hash bucket or degree list */
  Index first_col ;   /* first column in hash bucket */

  /* === Consider each column in the row ================================== */

  rp = &A [row_start] ;
  rp_end = rp + row_length ;
  while (rp < rp_end)
  {
    col = *rp++ ;
    if (COL_IS_DEAD (col))
    {
      continue ;
    }

    /* get hash number for this column */
    hash = Col [col].shared3.hash ;
    COLAMD_ASSERT (hash <= n_col) ;

    /* === Get the first column in this hash bucket ===================== */

    head_column = head [hash] ;
    if (head_column > COLAMD_EMPTY)
    {
      first_col = Col [head_column].shared3.headhash ;
    }
    else
    {
      first_col = - (head_column + 2) ;
    }

    /* === Consider each column in the hash bucket ====================== */

    for (super_c = first_col ; super_c != COLAMD_EMPTY ;
	 super_c = Col [super_c].shared4.hash_next)
    {
      COLAMD_ASSERT (COL_IS_ALIVE (super_c)) ;
      COLAMD_ASSERT (Col [super_c].shared3.hash == hash) ;
      length = Col [super_c].length ;

      /* prev_c is the column preceding column c in the hash bucket */
      prev_c = super_c ;

      /* === Compare super_c with all columns after it ================ */

      for (c = Col [super_c].shared4.hash_next ;
	   c != COLAMD_EMPTY ; c = Col [c].shared4.hash_next)
      {
	COLAMD_ASSERT (c != super_c) ;
	COLAMD_ASSERT (COL_IS_ALIVE (c)) ;
	COLAMD_ASSERT (Col [c].shared3.hash == hash) ;

	/* not identical if lengths or scores are different */
	if (Col [c].length != length ||
	    Col [c].shared2.score != Col [super_c].shared2.score)
	{
	  prev_c = c ;
	  continue ;
	}

	/* compare the two columns */
	cp1 = &A [Col [super_c].start] ;
	cp2 = &A [Col [c].start] ;

	for (i = 0 ; i < length ; i++)
	{
	  /* the columns are "clean" (no dead rows) */
	  COLAMD_ASSERT (ROW_IS_ALIVE (*cp1))  ;
	  COLAMD_ASSERT (ROW_IS_ALIVE (*cp2))  ;
	  /* row indices will same order for both supercols, */
	  /* no gather scatter nessasary */
	  if (*cp1++ != *cp2++)
	  {
	    break ;
	  }
	}

	/* the two columns are different if the for-loop "broke" */
	if (i != length)
	{
	  prev_c = c ;
	  continue ;
	}

	/* === Got it!  two columns are identical =================== */

	COLAMD_ASSERT (Col [c].shared2.score == Col [super_c].shared2.score) ;

	Col [super_c].shared1.thickness += Col [c].shared1.thickness ;
	Col [c].shared1.parent = super_c ;
	KILL_NON_PRINCIPAL_COL (c) ;
	/* order c later, in order_children() */
	Col [c].shared2.order = COLAMD_EMPTY ;
	/* remove c from hash bucket */
	Col [prev_c].shared4.hash_next = Col [c].shared4.hash_next ;
      }
    }

    /* === Empty this hash bucket ======================================= */

    if (head_column > COLAMD_EMPTY)
    {
      /* corresponding degree list "hash" is not empty */
      Col [head_column].shared3.headhash = COLAMD_EMPTY ;
    }
    else
    {
      /* corresponding degree list "hash" is empty */
      head [hash] = COLAMD_EMPTY ;
    }
  }
}